

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Search.h
# Opt level: O3

int sortMoves(moves *moveList,int bestMove)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  ulong local_38;
  
  uVar1 = moveList->count;
  uVar6 = (ulong)uVar1;
  lVar2 = (long)&local_38 - (uVar6 * 4 + 0xf & 0xfffffffffffffff0);
  if (0 < (int)uVar1) {
    uVar12 = 0;
    uVar13 = 5;
    if (side == 0) {
      uVar13 = 0xb;
    }
    uVar7 = 6;
    if (side != 0) {
      uVar7 = uVar12;
    }
    local_38 = uVar7;
    if ((uint)uVar7 <= uVar13) {
      uVar7 = (ulong)uVar13;
    }
    lVar14 = (long)ply;
    iVar9 = scorePV;
    do {
      uVar13 = moveList->moves[uVar12];
      iVar3 = 30000;
      if (uVar13 != bestMove) {
        if ((iVar9 == 0) || (pvTable[0][lVar14] != uVar13)) {
          if ((uVar13 >> 0x14 & 1) == 0) {
            iVar3 = 9000;
            if ((killerMoves[0][lVar14] != uVar13) &&
               (iVar3 = 8000, killerMoves[1][lVar14] != uVar13)) {
              iVar3 = *(int *)((long)historyMoves[0] +
                              (ulong)(uVar13 >> 4 & 0xfc) + (ulong)(uVar13 >> 4 & 0xf00));
            }
          }
          else {
            uVar4 = local_38;
            do {
              if ((bitboardsPieces[uVar4] & 1L << ((byte)(uVar13 >> 6) & 0x3f)) != 0)
              goto LAB_0010aa6e;
              uVar4 = uVar4 + 1;
            } while ((int)uVar7 + 1 != uVar4);
            uVar4 = 0;
LAB_0010aa6e:
            iVar3 = *(int *)((long)MVV_LVA[0] + uVar4 * 4 + (ulong)((uVar13 >> 0xc & 0xf) * 0x30)) +
                    10000;
          }
        }
        else {
          scorePV = 0;
          iVar9 = 0;
          iVar3 = 20000;
        }
      }
      *(int *)(lVar2 + uVar12 * 4) = iVar3;
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar6);
    if (0 < (int)uVar1) {
      lVar5 = 1;
      lVar14 = 0;
      do {
        lVar8 = lVar14 + 1;
        lVar10 = (long)(int)uVar6;
        lVar11 = lVar5;
        if (lVar8 < lVar10) {
          do {
            iVar9 = *(int *)(lVar2 + lVar14 * 4);
            iVar3 = *(int *)(lVar2 + lVar11 * 4);
            if (iVar9 < iVar3) {
              *(int *)(lVar2 + lVar14 * 4) = iVar3;
              *(int *)(lVar2 + lVar11 * 4) = iVar9;
              iVar9 = moveList->moves[lVar14];
              moveList->moves[lVar14] = moveList->moves[lVar11];
              moveList->moves[lVar11] = iVar9;
              uVar6 = (ulong)(uint)moveList->count;
            }
            lVar11 = lVar11 + 1;
          } while ((int)lVar11 < (int)uVar6);
          lVar10 = (long)(int)uVar6;
        }
        lVar5 = lVar5 + 1;
        lVar14 = lVar8;
      } while (lVar8 < lVar10);
    }
  }
  return (int)lVar2;
}

Assistant:

static inline int sortMoves(moves *moveList,int bestMove) {
    int moveScores[moveList->count];
    for (int i = 0; i < moveList->count; i++) {
        // if best move -> give A LOT of score
        if(bestMove == moveList->moves[i]){
            moveScores[i] = 30000;
        }
        else{
            // for each move, calculate score
            moveScores[i] = scoreMove(moveList->moves[i]);
        }
    }


    // bubble sort according to score. bigger score first, smaller score last
    for (int current_move = 0; current_move < moveList->count; current_move++) {
        for (int next_move = current_move + 1; next_move < moveList->count; next_move++) {

            if (moveScores[current_move] < moveScores[next_move]) {
                // swap scores
                int tempScore = moveScores[current_move];
                moveScores[current_move] = moveScores[next_move];
                moveScores[next_move] = tempScore;

                // swap moves
                int tempMove = moveList->moves[current_move];
                moveList->moves[current_move] = moveList->moves[next_move];
                moveList->moves[next_move] = tempMove;
            }
        }
    }
    return 1;
}